

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_init.c
# Opt level: O0

Atom getSupportedAtom(Atom *supportedAtoms,unsigned_long atomCount,char *atomName)

{
  Atom AVar1;
  ulong local_38;
  unsigned_long i;
  Atom atom;
  char *atomName_local;
  unsigned_long atomCount_local;
  Atom *supportedAtoms_local;
  
  AVar1 = XInternAtom(_glfw.x11.display,atomName,1);
  if (AVar1 != 0) {
    for (local_38 = 0; local_38 < atomCount; local_38 = local_38 + 1) {
      if (supportedAtoms[local_38] == AVar1) {
        return AVar1;
      }
    }
  }
  return 0;
}

Assistant:

static Atom getSupportedAtom(Atom* supportedAtoms,
                             unsigned long atomCount,
                             const char* atomName)
{
    Atom atom = XInternAtom(_glfw.x11.display, atomName, True);
    if (atom != None)
    {
        unsigned long i;

        for (i = 0;  i < atomCount;  i++)
        {
            if (supportedAtoms[i] == atom)
                return atom;
        }
    }

    return None;
}